

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_libc.cc
# Opt level: O3

bool absl::lts_20250127::time_internal::cctz::anon_unknown_10::make_time
               (civil_second *cs,int is_dst,time_t *t,tm *tm)

{
  undefined4 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined6 uVar4;
  undefined1 auVar5 [12];
  time_t tVar6;
  tm *ptVar7;
  bool bVar8;
  short sVar9;
  undefined1 auVar11 [16];
  tm tm2;
  tm local_50;
  undefined5 uVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined2 uVar14;
  
  tm->tm_year = (int)(cs->f_).y + -0x76c;
  tm->tm_mon = (cs->f_).m + -1;
  uVar1._0_1_ = (cs->f_).d;
  uVar1._1_1_ = (cs->f_).hh;
  uVar1._2_1_ = (cs->f_).mm;
  uVar1._3_1_ = (cs->f_).ss;
  uVar14 = CONCAT11(uVar1._3_1_,uVar1._3_1_);
  uVar10 = CONCAT14(uVar1._2_1_,uVar1);
  uVar2 = CONCAT35(CONCAT21(uVar14,uVar1._2_1_),uVar10);
  uVar4 = CONCAT51(CONCAT41((int)((ulong)uVar2 >> 0x20),uVar1._1_1_),uVar1._1_1_);
  sVar9 = CONCAT11((undefined1)uVar1,(undefined1)uVar1);
  uVar3 = CONCAT62(uVar4,sVar9);
  auVar13._8_4_ = 0;
  auVar13._0_8_ = uVar3;
  auVar13._12_2_ = uVar14;
  auVar13._14_2_ = uVar14;
  uVar14 = (undefined2)((ulong)uVar2 >> 0x20);
  auVar12._12_4_ = auVar13._12_4_;
  auVar12._8_2_ = 0;
  auVar12._0_8_ = uVar3;
  auVar12._10_2_ = uVar14;
  auVar11._10_6_ = auVar12._10_6_;
  auVar11._8_2_ = uVar14;
  auVar11._0_8_ = uVar3;
  uVar14 = (undefined2)uVar4;
  auVar5._4_8_ = auVar11._8_8_;
  auVar5._2_2_ = uVar14;
  auVar5._0_2_ = uVar14;
  tm->tm_sec = auVar12._12_4_ >> 0x18;
  tm->tm_min = auVar11._8_4_ >> 0x18;
  tm->tm_hour = auVar5._0_4_ >> 0x18;
  tm->tm_mday = (int)sVar9 >> 8;
  tm->tm_isdst = is_dst;
  tVar6 = mktime((tm *)tm);
  *t = tVar6;
  bVar8 = true;
  if (tVar6 == -1) {
    ptVar7 = localtime_r(t,&local_50);
    if ((((ptVar7 == (tm *)0x0) || (ptVar7->tm_year != tm->tm_year)) ||
        (ptVar7->tm_mon != tm->tm_mon)) ||
       (((ptVar7->tm_mday != tm->tm_mday || (ptVar7->tm_hour != tm->tm_hour)) ||
        ((ptVar7->tm_min != tm->tm_min || (ptVar7->tm_sec != tm->tm_sec)))))) {
      bVar8 = false;
    }
  }
  return bVar8;
}

Assistant:

bool make_time(const civil_second& cs, int is_dst, std::time_t* t,
               std::tm* tm) {
  tm->tm_year = static_cast<int>(cs.year() - year_t{1900});
  tm->tm_mon = cs.month() - 1;
  tm->tm_mday = cs.day();
  tm->tm_hour = cs.hour();
  tm->tm_min = cs.minute();
  tm->tm_sec = cs.second();
  tm->tm_isdst = is_dst;
  *t = std::mktime(tm);
  if (*t == std::time_t{-1}) {
    std::tm tm2;
    const std::tm* tmp = local_time(t, &tm2);
    if (tmp == nullptr || tmp->tm_year != tm->tm_year ||
        tmp->tm_mon != tm->tm_mon || tmp->tm_mday != tm->tm_mday ||
        tmp->tm_hour != tm->tm_hour || tmp->tm_min != tm->tm_min ||
        tmp->tm_sec != tm->tm_sec) {
      // A true error (not just one second before the epoch).
      return false;
    }
  }
  return true;
}